

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::getp_round_dec(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t prec_00;
  size_t __n;
  char *in_RDI;
  size_t prec;
  int exp;
  int post_idx;
  char *new_ext;
  int places;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  char **in_stack_ffffffffffffff90;
  vm_val_t *in_stack_ffffffffffffff98;
  void *__src;
  CVmObjBigNum *in_stack_ffffffffffffffa8;
  char *local_38;
  
  iVar1 = get_exp((char *)0x305ada);
  prec_00 = get_prec((char *)0x305aee);
  if ((getp_round_dec(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_round_dec(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_round_dec::desc,1);
    __cxa_guard_release(&getp_round_dec(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (iVar2 == 0) {
    iVar2 = CVmBif::pop_int_val();
    iVar3 = setup_getp_retval(in_stack_ffffffffffffffa8,(vm_obj_id_t)((ulong)in_RDI >> 0x20),
                              in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (iVar3 == 0) {
      __src = *(void **)(in_RDI + 8);
      __n = calc_alloc(prec_00);
      memcpy(local_38,__src,__n);
      if (iVar2 + iVar1 < 0) {
        set_zero(local_38);
      }
      else if (iVar2 + iVar1 < (int)prec_00) {
        round_to(local_38,in_stack_ffffffffffffff8c);
        normalize(in_RDI);
      }
      CVmStack::discard();
    }
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_round_dec(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *argc)
{
    int places;
    char *new_ext;
    int post_idx;
    int exp = get_exp(ext_);
    size_t prec = get_prec(ext_);
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the number of digits for rounding */
    places = CVmBif::pop_int_val(vmg0_);

    /* set up the return value */
    if (setup_getp_retval(vmg_ self, retval, &new_ext, prec))
        return TRUE;

    /* make a copy in the new object */
    memcpy(new_ext, ext_, calc_alloc(prec));

    /* 
     *   Determine if the first digit we're lopping off is actually
     *   represented in the number or not.  This digit position is the
     *   exponent plus the number of decimal places after the decimal to
     *   keep - if this value is at least zero and less than the
     *   precision, it's part of the number.  
     */
    post_idx = places + exp;
    if (post_idx < 0)
    {
        /* 
         *   the digit after the last digit to keep is actually before the
         *   beginning of the number, so the result of the rounding is
         *   simply zero 
         */
        set_zero(new_ext);
    }
    else if (post_idx >= (int)prec)
    {
        /* 
         *   the digit after the last digit to keep is past the end of the
         *   represented digits, so rounding has no effect at all - we'll
         *   simply return the same number 
         */
    }
    else
    {
        /* round it */
        round_to(new_ext, post_idx);

        /* normalize the result */
        normalize(new_ext);
    }

    /* remove my self-reference */
    G_stk->discard();

    /* handled */
    return TRUE;
}